

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

void __thiscall vkb::Result<vkb::Device>::destroy(Result<vkb::Device> *this)

{
  Result<vkb::Device> *this_local;
  
  if ((this->m_init & 1U) != 0) {
    Device::~Device((Device *)this);
  }
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }